

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int attach_set_offered_capabilities(ATTACH_HANDLE attach,AMQP_VALUE offered_capabilities_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x13d3;
  }
  else {
    iVar2 = 0x13e3;
    if (offered_capabilities_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(offered_capabilities_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(attach->composite_value,0xb,item_value);
        iVar2 = 0x13e9;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int attach_set_offered_capabilities(ATTACH_HANDLE attach, AMQP_VALUE offered_capabilities_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE offered_capabilities_amqp_value;
        if (offered_capabilities_value == NULL)
        {
            offered_capabilities_amqp_value = NULL;
        }
        else
        {
            offered_capabilities_amqp_value = amqpvalue_clone(offered_capabilities_value);
        }
        if (offered_capabilities_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 11, offered_capabilities_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(offered_capabilities_amqp_value);
        }
    }

    return result;
}